

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::start_checking(torrent *this)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type *peVar8;
  file_storage *this_00;
  undefined4 extraout_var_01;
  int iVar9;
  int iVar10;
  piece_index_t index;
  vector<sha256_hash> hashes;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> local_a8;
  int local_90;
  int local_8c;
  int local_88;
  uint local_84;
  undefined1 local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  pointer local_70;
  pointer pdStack_68;
  pointer pdStack_60;
  long *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *local_38;
  
  iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_80 = (undefined1  [8])(CONCAT44(extraout_var,iVar7) + 0x438);
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_78 & 0xffffffffffffff00);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_80);
  local_78._0_1_ = true;
  iVar7 = *(int *)(CONCAT44(extraout_var,iVar7) + 0x340);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
  iVar9 = (((this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length;
  iVar10 = 0x4000;
  if (iVar9 < 0x4000) {
    iVar10 = iVar9;
  }
  if (iVar9 < 1) {
    iVar10 = 0x4000;
  }
  iVar9 = (iVar10 * iVar7) / iVar9;
  iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_80 = (undefined1  [8])(CONCAT44(extraout_var_00,iVar7) + 0x438);
  local_78._0_1_ = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_80);
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_78._1_7_,1);
  iVar7 = *(int *)(CONCAT44(extraout_var_00,iVar7) + 0x33c);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
  iVar10 = 1;
  if (1 < iVar7) {
    iVar10 = iVar7;
  }
  local_90 = iVar10 * 2;
  if (iVar10 * 2 < iVar9) {
    local_90 = iVar9;
  }
  iVar7 = (this->m_checking_piece).m_val;
  local_90 = ((this->m_num_checked_pieces).m_val - iVar7) + local_90;
  if (0 < local_90) {
    if (iVar7 < (((this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_files).m_num_pieces) {
      local_38 = (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::torrent>;
      iVar7 = 0;
      while( true ) {
        if ((this->super_torrent_hot_members).m_picker._M_t.
            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
            (piece_picker *)0x0) {
          peVar8 = (this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          index.m_val = (this->m_checking_piece).m_val;
          while ((index.m_val < (peVar8->m_files).m_num_pieces &&
                 (bVar5 = piece_picker::have_piece
                                    ((this->super_torrent_hot_members).m_picker._M_t.
                                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                     _M_head_impl,index), bVar5))) {
            index.m_val = (this->m_checking_piece).m_val + 1;
            (this->m_checking_piece).m_val = index.m_val;
            (this->m_num_checked_pieces).m_val = (this->m_num_checked_pieces).m_val + 1;
            peVar8 = (this->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            ;
          }
        }
        peVar8 = (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar8->m_files).m_num_pieces <= (this->m_checking_piece).m_val) break;
        bVar5 = digest32<160L>::is_all_zeros(&(peVar8->m_info_hash).v1);
        local_a8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar6 = digest32<256L>::is_all_zeros
                          (&(((this->super_torrent_hot_members).m_torrent_file.
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_info_hash).v2);
        if (!bVar6) {
          this_00 = torrent_info::orig_files
                              ((this->super_torrent_hot_members).m_torrent_file.
                               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
          iVar9 = file_storage::blocks_in_piece2
                            (this_00,(piece_index_t)(this->m_checking_piece).m_val);
          ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
          resize(&local_a8,(long)iVar9);
        }
        pdVar3 = local_a8.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pdVar1 = local_a8.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[4])();
        local_84 = (this->m_storage).m_idx.m_val;
        local_88 = (this->m_checking_piece).m_val;
        local_8c = iVar7;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_80,
                   local_38);
        pdVar2 = local_a8.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_70 = local_a8.
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pdStack_68 = local_a8.
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        pdStack_60 = local_a8.
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58 = (long *)0x0;
        uStack_50 = 0;
        local_48 = (code *)0x0;
        pcStack_40 = (code *)0x0;
        local_58 = (long *)operator_new(0x28);
        p_Var4 = local_78;
        *local_58 = (long)local_80;
        local_58[1] = 0;
        local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_58[1] = (long)p_Var4;
        local_80 = (undefined1  [8])0x0;
        local_58[2] = (long)pdVar2;
        local_58[3] = (long)pdStack_68;
        local_58[4] = (long)pdStack_60;
        pdStack_60 = (pointer)0x0;
        local_70 = (pointer)0x0;
        pdStack_68 = (pointer)0x0;
        pcStack_40 = ::std::
                     _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2455:7)>
                     ::_M_invoke;
        local_48 = ::std::
                   _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2455:7)>
                   ::_M_manager;
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar9) + 0x20))
                  ((long *)CONCAT44(extraout_var_01,iVar9),local_84,local_88,pdVar1,
                   (long)pdVar3 - (long)pdVar1 >> 5,!bVar5 << 5 | 0x18,&local_58);
        iVar7 = local_8c;
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,3);
        }
        if (local_70 != (pointer)0x0) {
          operator_delete(local_70,(long)pdStack_60 - (long)local_70);
        }
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
        }
        iVar10 = (this->m_checking_piece).m_val + 1;
        (this->m_checking_piece).m_val = iVar10;
        iVar9 = (((this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_files).m_num_pieces;
        if (local_a8.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.
                          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a8.
                                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.
                                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((iVar9 <= iVar10) || (iVar7 = iVar7 + 1, iVar7 == local_90)) break;
      }
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"start_checking, m_checking_piece: %d",
                 (ulong)(uint)(this->m_checking_piece).m_val);
      return;
    }
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"start_checking, checking_piece >= num_pieces. %d >= %d");
  }
  return;
}

Assistant:

void torrent::start_checking() try
	{
		TORRENT_ASSERT(should_check_files());

		int num_outstanding = settings().get_int(settings_pack::checking_mem_usage) * block_size()
			/ m_torrent_file->piece_length();
		// if we only keep a single read operation in-flight at a time, we suffer
		// significant performance degradation. Always keep at least 4 jobs
		// outstanding per hasher thread
		int const min_outstanding
			= std::max(1, settings().get_int(settings_pack::hashing_threads)) * 2;
		if (num_outstanding < min_outstanding) num_outstanding = min_outstanding;

		// subtract the number of pieces we already have outstanding
		num_outstanding -= (static_cast<int>(m_checking_piece)
			- static_cast<int>(m_num_checked_pieces));
		if (num_outstanding <= 0) return;

		// we might already have some outstanding jobs, if we were paused and
		// resumed quickly, before the outstanding jobs completed
		if (m_checking_piece >= m_torrent_file->end_piece())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("start_checking, checking_piece >= num_pieces. %d >= %d"
				, static_cast<int>(m_checking_piece), m_torrent_file->num_pieces());
#endif
			return;
		}

		for (int i = 0; i < num_outstanding; ++i)
		{
			if (has_picker())
			{
				// skip pieces we already have
				while (m_checking_piece < m_torrent_file->end_piece()
					&& m_picker->have_piece(m_checking_piece))
				{
					++m_checking_piece;
					++m_num_checked_pieces;
				}
			}

			if (m_checking_piece >= m_torrent_file->end_piece()) break;

			auto flags = disk_interface::sequential_access | disk_interface::volatile_read;
			if (torrent_file().info_hashes().has_v1())
				flags |= disk_interface::v1_hash;
			aux::vector<sha256_hash> hashes;
			if (torrent_file().info_hashes().has_v2())
				hashes.resize(torrent_file().orig_files().blocks_in_piece2(m_checking_piece));

			span<sha256_hash> v2_span(hashes);
			m_ses.disk_thread().async_hash(m_storage, m_checking_piece, v2_span, flags
				, [self = shared_from_this(), hashes1 = std::move(hashes)]
				(piece_index_t p, sha1_hash const& h, storage_error const& error) mutable
				{ self->on_piece_hashed(std::move(hashes1), p, h, error); });
			++m_checking_piece;
			if (m_checking_piece >= m_torrent_file->end_piece()) break;
		}
		m_ses.deferred_submit_jobs();
#ifndef TORRENT_DISABLE_LOGGING
		debug_log("start_checking, m_checking_piece: %d"
			, static_cast<int>(m_checking_piece));
#endif
	}
	catch (...) { handle_exception(); }